

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O3

void __thiscall StatAggregator::~StatAggregator(StatAggregator *this)

{
  stat_history_t *psVar1;
  pointer puVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = this->num_stats;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      psVar1 = this->t_stats[lVar6];
      if (psVar1 != (stat_history_t *)0x0) {
        puVar2 = psVar1[-1].latencies.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (puVar2 != (pointer)0x0) {
          lVar5 = (long)puVar2 * 0x38;
          do {
            pvVar3 = *(void **)((long)psVar1 + lVar5 + -0x18);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3);
            }
            pvVar3 = *(void **)((long)&psVar1[-1].name._M_dataplus._M_p + lVar5);
            if ((void *)((long)psVar1 + lVar5 + -0x28) != pvVar3) {
              operator_delete(pvVar3);
            }
            lVar5 = lVar5 + -0x38;
          } while (lVar5 != 0);
        }
        operator_delete__(&psVar1[-1].latencies.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
        iVar4 = this->num_stats;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  if (this->t_stats != (StatMatrix_t)0x0) {
    operator_delete__(this->t_stats);
    return;
  }
  return;
}

Assistant:

StatAggregator::~StatAggregator() {

    for (int i = 0; i < num_stats; ++i) {
        delete[] t_stats[i];
    }
    delete[] t_stats;
}